

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
wasm::WATParser::Lexer::takeString_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Lexer *this)

{
  undefined8 *puVar1;
  pointer pAVar2;
  undefined1 uVar3;
  ulong uVar4;
  string_view in;
  _Alloc_hider local_80;
  size_type local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined1 local_60 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexStrResult> result;
  
  in = next(this);
  anon_unknown_0::str((optional<wasm::WATParser::(anonymous_namespace)::LexStrResult> *)local_60,in)
  ;
  uVar3 = result.
          super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>.
          _M_payload.
          super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
          .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>.
          _M_payload._M_value.str.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged;
  if (result.
      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>.
      _M_payload.
      super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
      .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>._M_payload
      ._M_value.str.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    this->pos = this->pos + (long)local_60;
    pAVar2 = (this->annotations).
             super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->annotations).
        super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
        ._M_impl.super__Vector_impl_data._M_finish != pAVar2) {
      (this->annotations).
      super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>.
      _M_impl.super__Vector_impl_data._M_finish = pAVar2;
    }
    skipSpace(this);
    if (result.
        super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>.
        _M_payload.
        super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
        .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>.
        _M_payload._40_1_ == '\x01') {
      (__return_storage_ptr__->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
      (__return_storage_ptr__->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_dataplus._M_p =
           (pointer)((long)&(__return_storage_ptr__->
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            )._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload + 0x10);
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,
                 result.
                 super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                 ._M_payload.
                 super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                 .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                 ._M_payload._M_value.super_LexResult.span._M_str,
                 result.
                 super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                 ._M_payload.
                 super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                 .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                 ._M_payload._8_8_ +
                 (long)result.
                       super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                       ._M_payload.
                       super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                       .
                       super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                       ._M_payload._M_value.str.
                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ._M_payload._0_8_);
    }
    else {
      if (local_60 == (undefined1  [8])0x0) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",1,
                   0);
      }
      uVar4 = (long)local_60 - 1U;
      if ((long)local_60 - 2U <= (long)local_60 - 1U) {
        uVar4 = (long)local_60 - 2U;
      }
      local_80._M_p = (pointer)&local_70;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_80,
                 result.
                 super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                 ._M_payload.
                 super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                 .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                 ._M_payload._M_value.super_LexResult.span._M_len + 1,
                 result.
                 super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                 ._M_payload.
                 super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                 .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                 ._M_payload._M_value.super_LexResult.span._M_len + uVar4 + 1);
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->
                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                       )._M_payload.
                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ._M_payload + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload = puVar1;
      if (local_80._M_p == (pointer)&local_70) {
        *puVar1 = local_70;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 )._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload + 0x18) = uStack_68;
      }
      else {
        (__return_storage_ptr__->
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_dataplus._M_p = local_80._M_p;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 )._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload + 0x10) = local_70;
      }
      (__return_storage_ptr__->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_string_length = local_78;
    }
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = true;
  }
  if ((result.
       super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>.
       _M_payload.
       super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
       .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>.
       _M_payload._M_value.str.
       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._M_engaged == true) &&
     (result.
      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>.
      _M_payload.
      super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
      .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>._M_payload
      ._M_value.str.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false,
     result.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
     ._M_payload.
     super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
     .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>._M_payload.
     _40_1_ == '\x01')) {
    result.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>.
    _M_payload.
    super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
    .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>._M_payload.
    _40_1_ = 0;
    if (result.
        super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>.
        _M_payload.
        super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
        .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>.
        _M_payload._M_value.super_LexResult.span._M_str !=
        (char *)((long)&result.
                        super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                        ._M_payload.
                        super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                        .
                        super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                        ._M_payload + 0x18)) {
      operator_delete(result.
                      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                      ._M_payload.
                      super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                      .
                      super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                      ._M_payload._M_value.super_LexResult.span._M_str,
                      result.
                      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                      ._M_payload.
                      super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                      .
                      super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                      ._M_payload._24_8_ + 1);
    }
  }
  if ((bool)uVar3 == false) {
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> Lexer::takeString() {
  if (auto result = str(next())) {
    pos += result->span.size();
    advance();
    if (result->str) {
      return result->str;
    }
    // Remove quotes.
    return std::string(result->span.substr(1, result->span.size() - 2));
  }
  return std::nullopt;
}